

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::computeResWithCrseSolFineCor(MLMG *this,int calev,int falev)

{
  pointer pVVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  pointer pAVar7;
  undefined8 local_64;
  int local_5c;
  undefined8 local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_64 = 0;
  local_5c = 0;
  if (this->cf_strategy == ghostnodes) {
    iVar5 = (*this->linop->_vptr_MLLinOp[6])(this->linop,(ulong)(uint)falev,0);
    iVar6 = (*this->linop->_vptr_MLLinOp[6])(this->linop,calev,0);
    local_5c = iVar5;
    if (iVar6 < iVar5) {
      local_5c = iVar6;
    }
    local_64 = CONCAT44(local_5c,local_5c);
  }
  pAVar7 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = pAVar7 + calev;
  local_40 = (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = local_40 + calev;
  pVVar1 = (this->res).
           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(undefined8 *)
           &pVVar1[calev].super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
  local_38 = pAVar7 + falev;
  local_40 = local_40 + falev;
  local_58 = *(undefined8 *)
              &(this->cor).
               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[falev].
               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
  uVar3 = *(undefined8 *)
           &pVVar1[falev].super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
  uVar4 = *(undefined8 *)
           &(this->rescor).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[falev].
            super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
  pAVar7 = pAVar7 + (long)calev + -1;
  if (calev < 1) {
    pAVar7 = (pointer)0x0;
  }
  (*this->linop->_vptr_MLLinOp[0x34])(this->linop,calev,uVar2,local_48,local_50,pAVar7);
  (*this->linop->_vptr_MLLinOp[0x35])(this->linop,(ulong)(uint)falev,0,uVar4,local_58,uVar3,0,0);
  (*this->linop->_vptr_MLLinOp[0x2c])(this->linop,uVar3,uVar4,&local_64);
  (*this->linop->_vptr_MLLinOp[0x36])
            (this->linop,calev,uVar2,local_48,local_50,uVar3,local_38,local_40);
  (*this->linop->_vptr_MLLinOp[0x37])(this->linop,calev,uVar2,uVar3);
  return;
}

Assistant:

void
MLMG::computeResWithCrseSolFineCor (int calev, int falev)
{
    BL_PROFILE("MLMG::computeResWithCrseSolFineCor()");

    IntVect nghost(0);
    if (cf_strategy == CFStrategy::ghostnodes) nghost = IntVect(std::min(linop.getNGrow(falev),linop.getNGrow(calev)));

    Any&       crse_sol = sol[calev];
    const Any& crse_rhs = rhs[calev];
    Any&       crse_res = res[calev][0];

    Any&       fine_sol = sol[falev];
    const Any& fine_rhs = rhs[falev];
    Any&       fine_cor = cor[falev][0];
    Any&       fine_res = res[falev][0];
    Any&    fine_rescor = rescor[falev][0];

    const Any* crse_bcdata = (calev > 0) ? &(sol[calev-1]) : nullptr;
    linop.AnySolutionResidual(calev, crse_res, crse_sol, crse_rhs, crse_bcdata);

    linop.AnyCorrectionResidual(falev, 0, fine_rescor, fine_cor, fine_res, BCMode::Homogeneous);
    linop.AnyCopy(fine_res, fine_rescor, nghost);

    linop.AnyReflux(calev, crse_res, crse_sol, crse_rhs, fine_res, fine_sol, fine_rhs);

    linop.AnyAvgDownResAmr(calev, crse_res, fine_res);
}